

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O3

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateI32Vec
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst,uint32_t num_components,
          function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *diag)

{
  bool bVar1;
  spv_result_t sVar2;
  uint32_t uVar3;
  ostream *poVar4;
  long *plVar5;
  Instruction *inst_00;
  size_type *psVar6;
  long lVar7;
  char *pcVar8;
  uint32_t underlying_type;
  ostringstream ss;
  undefined1 local_1cc [12];
  long local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  inst_00 = (Instruction *)local_1cc;
  local_1cc._0_4_ = 0;
  sVar2 = GetUnderlyingType(this->_,(Decoration *)(ulong)(uint)decoration->struct_member_index_,inst
                            ,(uint32_t *)inst_00);
  if (sVar2 == SPV_SUCCESS) {
    bVar1 = ValidationState_t::IsIntVectorType(this->_,local_1cc._0_4_);
    if (bVar1) {
      ValidationState_t::GetDimension(this->_,local_1cc._0_4_);
      uVar3 = ValidationState_t::GetDimension(this->_,local_1cc._0_4_);
      if (uVar3 == num_components) {
        uVar3 = ValidationState_t::GetBitWidth(this->_,local_1cc._0_4_);
        if (uVar3 == 0x20) {
          return SPV_SUCCESS;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                  ((string *)(local_1cc + 4),decoration,(Decoration *)inst,inst_00);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)local_1cc._4_8_,local_1c0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4," has components with bit width ",0x1f);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        pcVar8 = ".";
        lVar7 = 1;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                  ((string *)(local_1cc + 4),decoration,(Decoration *)inst,inst_00);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)local_1cc._4_8_,local_1c0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," has ",5);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        pcVar8 = " components.";
        lVar7 = 0xc;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar8,lVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1cc._4_8_ != &local_1b8) {
        operator_delete((void *)local_1cc._4_8_,local_1b8._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      if ((diag->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_002a82b1:
        std::__throw_bad_function_call();
      }
      sVar2 = (*diag->_M_invoker)((_Any_data *)diag,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(local_1cc + 4));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1cc._4_8_ != &local_1b8) {
        operator_delete((void *)local_1cc._4_8_,local_1b8._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    else {
      (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                ((string *)(local_1cc + 4),decoration,(Decoration *)inst,inst_00);
      plVar5 = (long *)std::__cxx11::string::append((char *)(local_1cc + 4));
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_1a8[0].field_2._0_8_ = *psVar6;
        local_1a8[0].field_2._8_4_ = *(undefined4 *)(plVar5 + 3);
        local_1a8[0].field_2._12_4_ = *(uint32_t *)((long)plVar5 + 0x1c);
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
      }
      else {
        local_1a8[0].field_2._0_8_ = *psVar6;
        local_1a8[0]._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_1a8[0]._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((diag->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_002a82b1;
      sVar2 = (*diag->_M_invoker)((_Any_data *)diag,local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1cc._4_8_ != &local_1b8) {
        operator_delete((void *)local_1cc._4_8_,local_1b8._M_allocated_capacity + 1);
      }
    }
  }
  return sVar2;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateI32Vec(
    const Decoration& decoration, const Instruction& inst,
    uint32_t num_components,
    const std::function<spv_result_t(const std::string& message)>& diag) {
  uint32_t underlying_type = 0;
  if (spv_result_t error =
          GetUnderlyingType(_, decoration, inst, &underlying_type)) {
    return error;
  }

  if (!_.IsIntVectorType(underlying_type)) {
    return diag(GetDefinitionDesc(decoration, inst) + " is not an int vector.");
  }

  const uint32_t actual_num_components = _.GetDimension(underlying_type);
  if (_.GetDimension(underlying_type) != num_components) {
    std::ostringstream ss;
    ss << GetDefinitionDesc(decoration, inst) << " has "
       << actual_num_components << " components.";
    return diag(ss.str());
  }

  const uint32_t bit_width = _.GetBitWidth(underlying_type);
  if (bit_width != 32) {
    std::ostringstream ss;
    ss << GetDefinitionDesc(decoration, inst)
       << " has components with bit width " << bit_width << ".";
    return diag(ss.str());
  }

  return SPV_SUCCESS;
}